

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall Parser::~Parser(Parser *this)

{
  uint uVar1;
  BackgroundParser *this_00;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  JobProcessor *pJVar6;
  uint i;
  ulong uVar7;
  
  ReleaseTemporaryGuestArena(this);
  if (this->m_hasParallelJob == true) {
    this_00 = this->m_scriptContext->backgroundParser;
    if (this_00 == (BackgroundParser *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x8a,"(bgp)","bgp");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pJVar6 = JsUtil::JobManager::Processor((JobManager *)this_00);
    bVar4 = JsUtil::JobProcessor::ProcessesInBackground(pJVar6);
    if (bVar4) {
      pJVar6 = JsUtil::JobManager::Processor((JobManager *)this_00);
      uVar1 = *(uint *)&pJVar6[2].isClosed;
      pp_Var2 = pJVar6[3]._vptr_JobProcessor;
      for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
        pp_Var2[uVar7][9] = (code)0x1;
      }
    }
  }
  Scanner<UTF8EncodingPolicyBase<false>_>::~Scanner(&this->m_scan);
  SList<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>::~SList
            (&this->m_registeredRegexPatterns);
  Memory::AutoRecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::~AutoRecyclerRootPtr
            (&this->m_tempGuestArena);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this);
  return;
}

Assistant:

Parser::~Parser(void)
{
    this->ReleaseTemporaryGuestArena();

#if ENABLE_BACKGROUND_PARSING
    if (this->m_hasParallelJob)
    {
        // Let the background threads know that they can decommit their arena pages.
        BackgroundParser *bgp = m_scriptContext->GetBackgroundParser();
        Assert(bgp);
        if (bgp->Processor()->ProcessesInBackground())
        {
            JsUtil::BackgroundJobProcessor *processor = static_cast<JsUtil::BackgroundJobProcessor*>(bgp->Processor());

            bool result = processor->IterateBackgroundThreads([&](JsUtil::ParallelThreadData *threadData)->bool {
                threadData->canDecommit = true;
                return false;
            });
            Assert(result);
        }
    }
#endif
}